

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfsintegration.cpp
# Opt level: O0

void __thiscall QEglFSIntegration::QEglFSIntegration(QEglFSIntegration *this)

{
  int iVar1;
  QPlatformIntegration *this_00;
  QPlatformFontDatabase *p;
  QPlatformIntegration *in_RDI;
  QPlatformNativeInterface *in_stack_ffffffffffffffe0;
  
  QPlatformIntegration::QPlatformIntegration(in_RDI);
  QPlatformNativeInterface::QPlatformNativeInterface(in_stack_ffffffffffffffe0);
  QNativeInterface::Private::QEvdevKeyMapper::QEvdevKeyMapper((QEvdevKeyMapper *)(in_RDI + 0x18));
  QNativeInterface::Private::QEGLIntegration::QEGLIntegration((QEGLIntegration *)(in_RDI + 0x20));
  *(undefined ***)in_RDI = &PTR__QEglFSIntegration_00183aa8;
  *(undefined ***)(in_RDI + 8) = &PTR_metaObject_00183c20;
  *(undefined ***)(in_RDI + 0x18) = &PTR__QEglFSIntegration_00183d10;
  *(undefined ***)(in_RDI + 0x20) = &PTR__QEglFSIntegration_00183d40;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  this_00 = in_RDI + 0x40;
  p = (QPlatformFontDatabase *)operator_new(8);
  QFontconfigDatabase::QFontconfigDatabase((QFontconfigDatabase *)this_00);
  QScopedPointer<QPlatformFontDatabase,_QScopedPointerDeleter<QPlatformFontDatabase>_>::
  QScopedPointer((QScopedPointer<QPlatformFontDatabase,_QScopedPointerDeleter<QPlatformFontDatabase>_>
                  *)this_00,p);
  QScopedPointer<QPlatformServices,_QScopedPointerDeleter<QPlatformServices>_>::QScopedPointer
            ((QScopedPointer<QPlatformServices,_QScopedPointerDeleter<QPlatformServices>_> *)
             (in_RDI + 0x48),(QPlatformServices *)0x0);
  QScopedPointer<QFbVtHandler,_QScopedPointerDeleter<QFbVtHandler>_>::QScopedPointer
            ((QScopedPointer<QFbVtHandler,_QScopedPointerDeleter<QFbVtHandler>_> *)(in_RDI + 0x50),
             (QFbVtHandler *)0x0);
  QPointer<QWindow>::QPointer((QPointer<QWindow> *)0x120e38);
  in_RDI[0x68] = (QPlatformIntegration)0x0;
  iVar1 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_DISABLE_INPUT",(bool *)0x0);
  in_RDI[0x68] = (QPlatformIntegration)(iVar1 != 0);
  initResources();
  return;
}

Assistant:

QEglFSIntegration::QEglFSIntegration()
    : m_display(EGL_NO_DISPLAY),
      m_inputContext(nullptr),
      m_fontDb(new QGenericUnixFontDatabase),
      m_disableInputHandlers(false)
{
    m_disableInputHandlers = qEnvironmentVariableIntValue("QT_QPA_EGLFS_DISABLE_INPUT");

    initResources();
}